

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quad.cpp
# Opt level: O2

float * __thiscall Quad::toVertices(Quad *this,float scale)

{
  float *pfVar1;
  Vec2d *this_00;
  int i;
  ulong uVar2;
  float fVar3;
  
  pfVar1 = (float *)operator_new__(0x20);
  for (uVar2 = 0; uVar2 < 8; uVar2 = uVar2 + 2) {
    this_00 = Vec2d::getScale(*(Vec2d **)((long)this->vertices + uVar2 * 4),scale);
    fVar3 = Vec2d::getX(this_00);
    pfVar1[uVar2] = fVar3;
    fVar3 = Vec2d::getY(this_00);
    pfVar1[uVar2 + 1] = fVar3;
    operator_delete(this_00);
  }
  return pfVar1;
}

Assistant:

float* Quad::toVertices(float scale) {
    float* floatVertices = new float[8];
    
    for (int i=0; i < 8; i+=2) {
        Vec2d* rotatedCoord = vertices[i/2]->getScale(scale);
        
        floatVertices[i]   = rotatedCoord->getX();
        floatVertices[i+1] = rotatedCoord->getY();
        
        delete rotatedCoord;
        rotatedCoord = nullptr;
    }
    
    return floatVertices;
}